

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevcd_mv_pred.c
# Opt level: O3

void ihevcd_scale_collocated_mv
               (mv_t *ps_mv,WORD32 cur_ref_poc,WORD32 col_ref_poc,WORD32 col_poc,WORD32 cur_poc)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 in_XMM3 [16];
  undefined1 auVar9 [16];
  
  uVar3 = col_poc - col_ref_poc;
  if (col_poc - col_ref_poc < -0x7f) {
    uVar3 = 0xffffff80;
  }
  if (0x7e < (int)uVar3) {
    uVar3 = 0x7f;
  }
  iVar4 = cur_poc - cur_ref_poc;
  if (iVar4 < -0x7f) {
    iVar4 = -0x80;
  }
  if (0x7e < iVar4) {
    iVar4 = 0x7f;
  }
  uVar1 = -uVar3;
  if (0 < (int)uVar3) {
    uVar1 = uVar3;
  }
  iVar2 = (short)((int)((uint)(ushort)((short)(uVar1 >> 1) >> 0xf) << 0x10 |
                       uVar1 >> 1 & 0xffff | 0x4000) / (int)(short)uVar3) * iVar4 + 0x20 >> 6;
  iVar4 = -0x1000;
  if (-0x1000 < iVar2) {
    iVar4 = iVar2;
  }
  if (0xffe < iVar4) {
    iVar4 = 0xfff;
  }
  auVar9._4_4_ = iVar4;
  auVar9._0_4_ = iVar4;
  auVar9._8_8_ = 0;
  auVar5 = pmovzxwd(ZEXT416((uint)*ps_mv),ZEXT416((uint)*ps_mv));
  auVar5 = pmaddwd(auVar5,auVar9);
  auVar7._8_4_ = 0xffffffff;
  auVar7._0_8_ = 0xffffffffffffffff;
  auVar7._12_4_ = 0xffffffff;
  auVar8._0_4_ = -(uint)(auVar5._0_4_ == 0);
  auVar8._4_4_ = -(uint)(auVar5._4_4_ == 0);
  auVar8._8_4_ = -(uint)(auVar5._8_4_ == 0);
  auVar8._12_4_ = -(uint)(auVar5._12_4_ == 0);
  auVar9 = pabsd(in_XMM3,auVar5);
  auVar6._0_4_ = -(uint)(-1 < auVar5._0_4_);
  auVar6._4_4_ = -(uint)(-1 < auVar5._4_4_);
  auVar6._8_4_ = -(uint)(-1 < auVar5._8_4_);
  auVar6._12_4_ = -(uint)(-1 < auVar5._12_4_);
  auVar5._0_4_ = auVar9._0_4_ + 0x7fU >> 8;
  auVar5._4_4_ = auVar9._4_4_ + 0x7fU >> 8;
  auVar5._8_4_ = auVar9._8_4_ >> 8;
  auVar5._12_4_ = auVar9._12_4_ >> 8;
  auVar5 = pmulld(auVar5,auVar6 ^ auVar7 | ~auVar8 & _DAT_00173010);
  auVar5 = packssdw(auVar5,auVar5);
  *ps_mv = auVar5._0_4_;
  return;
}

Assistant:

void ihevcd_scale_collocated_mv(mv_t *ps_mv,
                                WORD32 cur_ref_poc,
                                WORD32 col_ref_poc,
                                WORD32 col_poc,
                                WORD32 cur_poc)
{
    WORD32 td, tb, tx;
    WORD32 dist_scale_factor;
    WORD32 mvx, mvy;

    td = CLIP_S8(col_poc - col_ref_poc);
    tb = CLIP_S8(cur_poc - cur_ref_poc);

    tx = (16384 + (abs(td) >> 1)) / td;

    dist_scale_factor = (tb * tx + 32) >> 6;
    dist_scale_factor = CLIP3(dist_scale_factor, -4096, 4095);

    mvx = ps_mv->i2_mvx;
    mvy = ps_mv->i2_mvy;

    mvx = SIGN(dist_scale_factor * mvx)
                    * ((abs(dist_scale_factor * mvx) + 127) >> 8);
    mvy = SIGN(dist_scale_factor * mvy)
                    * ((abs(dist_scale_factor * mvy) + 127) >> 8);

    ps_mv->i2_mvx = CLIP_S16(mvx);
    ps_mv->i2_mvy = CLIP_S16(mvy);
}